

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

bool slang::syntax::SyntaxFacts::isStrength0(TokenKind kind)

{
  TokenKind kind_local;
  bool local_1;
  
  if ((((kind == HighZ0Keyword) || (kind == Pull0Keyword)) || (kind == Strong0Keyword)) ||
     ((kind == Supply0Keyword || (kind == Weak0Keyword)))) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SyntaxFacts::isStrength0(TokenKind kind) {
    switch (kind) {
        case TokenKind::Strong0Keyword:
        case TokenKind::Weak0Keyword:
        case TokenKind::Pull0Keyword:
        case TokenKind::Supply0Keyword:
        case TokenKind::HighZ0Keyword:
            return true;
        default:
            return false;
    }
}